

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

int SSL_CTX_set_alpn_protos(SSL_CTX *ctx,uint8_t *protos,size_t protos_len)

{
  Span<const_unsigned_char> in;
  bool bVar1;
  size_t extraout_RDX;
  Span<const_unsigned_char> in_00;
  undefined1 local_38 [8];
  Span<const_unsigned_char> span;
  size_t protos_len_local;
  uint8_t *protos_local;
  SSL_CTX *ctx_local;
  
  span.size_ = protos_len;
  bssl::Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)local_38,protos,protos_len);
  bVar1 = bssl::Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)local_38);
  if ((bVar1) ||
     (in_00.size_ = extraout_RDX, in_00.data_ = span.data_,
     bVar1 = bssl::ssl_is_valid_alpn_list((bssl *)local_38,in_00), bVar1)) {
    in.size_ = (size_t)span.data_;
    in.data_ = (uchar *)local_38;
    bVar1 = bssl::Array<unsigned_char>::CopyFrom(&ctx->alpn_client_proto_list,in);
    ctx_local._4_4_ = (uint)!bVar1;
  }
  else {
    ERR_put_error(0x10,0,0x13b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                  ,0x8a5);
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

int SSL_CTX_set_alpn_protos(SSL_CTX *ctx, const uint8_t *protos,
                            size_t protos_len) {
  // Note this function's return value is backwards.
  auto span = Span(protos, protos_len);
  if (!span.empty() && !ssl_is_valid_alpn_list(span)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_ALPN_PROTOCOL_LIST);
    return 1;
  }
  return ctx->alpn_client_proto_list.CopyFrom(span) ? 0 : 1;
}